

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals
          (SPxSolverBase<double> *this,int leaveIdx,Status *leaveStat,SPxId *leaveId,
          double *leaveMax,double *leavebound,int *leaveNum,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  double *pdVar1;
  double dVar2;
  DataKey DVar3;
  double dVar4;
  int iVar5;
  Status SVar6;
  long lVar7;
  undefined8 *puVar8;
  pointer pdVar9;
  Status *pSVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = &this->super_SPxBasisBase<double>;
  DVar3 = (this->super_SPxBasisBase<double>).theBaseId.data[leaveIdx].super_DataKey;
  leaveId->super_DataKey = DVar3;
  if (-1 < DVar3.info) {
    SPxColId::SPxColId((SPxColId *)&local_50,leaveId);
    iVar5 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_50);
    *leaveNum = iVar5;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    SVar6 = pSVar10[iVar5];
    *leaveStat = SVar6;
    switch(SVar6) {
    case D_FREE:
      pSVar10[iVar5] = P_FIXED;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar5];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar5];
      dVar12 = objChange->sum;
      dVar2 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar2 - dVar12)) + (dVar12 - (dVar2 - (dVar2 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar2;
LAB_001c0666:
      dVar11 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
      pdVar1 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + leaveIdx;
      if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) break;
      goto LAB_001c06ab;
    case D_ON_UPPER:
      pSVar10[iVar5] = P_ON_LOWER;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar5];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar5];
      dVar12 = objChange->sum;
      dVar2 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar2 - dVar12)) + (dVar12 - (dVar2 - (dVar2 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar2;
      break;
    case D_ON_LOWER:
      pSVar10[iVar5] = P_ON_UPPER;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar5];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar5];
      dVar12 = objChange->sum;
      dVar2 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar2 - dVar12)) + (dVar12 - (dVar2 - (dVar2 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar2;
      goto LAB_001c06ab;
    case D_ON_BOTH:
      dVar11 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx];
      pdVar1 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + leaveIdx;
      if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
        ::soplex::infinity::__tls_init();
        dVar11 = *(double *)(in_FS_OFFSET + -8);
        *leaveMax = -dVar11;
        iVar5 = *leaveNum;
        dVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar5];
        *leavebound = dVar12;
        dVar12 = dVar12 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar5];
        dVar2 = objChange->sum;
        dVar4 = dVar2 + dVar12;
        objChange->c = (dVar12 - (dVar4 - dVar2)) + (dVar2 - (dVar4 - (dVar4 - dVar2))) +
                       objChange->c;
        objChange->sum = dVar4;
        ::soplex::infinity::__tls_init();
        iVar5 = *leaveNum;
        (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = -dVar11;
        (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar5] = P_ON_UPPER;
        return;
      }
      ::soplex::infinity::__tls_init();
      dVar11 = *(double *)(in_FS_OFFSET + -8);
      *leaveMax = dVar11;
      iVar5 = *leaveNum;
      dVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar5];
      *leavebound = dVar12;
      dVar12 = dVar12 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar5];
      dVar2 = objChange->sum;
      dVar4 = dVar2 + dVar12;
      objChange->c = (dVar12 - (dVar4 - dVar2)) + (dVar2 - (dVar4 - (dVar4 - dVar2))) + objChange->c
      ;
      objChange->sum = dVar4;
      ::soplex::infinity::__tls_init();
      iVar5 = *leaveNum;
      (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar5] = dVar11;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar5] = P_ON_LOWER;
      return;
    case P_ON_LOWER:
      SVar6 = SPxBasisBase<double>::dualColStatus(this_00,iVar5);
      iVar5 = *leaveNum;
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c03a6:
      pSVar10[iVar5] = SVar6;
      *leavebound = 0.0;
      break;
    default:
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XLEAVE03 This should never happen.","");
      *puVar8 = &PTR__SPxException_006a9ee8;
      puVar8[1] = puVar8 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar8 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar8 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      SVar6 = SPxBasisBase<double>::dualColStatus(this_00,iVar5);
      iVar5 = *leaveNum;
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c069c:
      pSVar10[iVar5] = SVar6;
      *leavebound = 0.0;
LAB_001c06ab:
      ::soplex::infinity::__tls_init();
      *leaveMax = -*(double *)(in_FS_OFFSET + -8);
      return;
    case P_FREE:
      SVar6 = SPxBasisBase<double>::dualColStatus(this_00,iVar5);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[*leaveNum] = SVar6;
      dVar11 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
      pdVar1 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + leaveIdx;
      if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
        *leavebound = dVar11;
        goto LAB_001c06ab;
      }
      *leavebound = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[leaveIdx];
    }
    ::soplex::infinity::__tls_init();
    *leaveMax = *(double *)(in_FS_OFFSET + -8);
    return;
  }
  SPxRowId::SPxRowId((SPxRowId *)&local_50,leaveId);
  iVar5 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set,&local_50);
  *leaveNum = iVar5;
  pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
  SVar6 = pSVar10[iVar5];
  *leaveStat = SVar6;
  switch(SVar6) {
  case D_FREE:
    pSVar10[iVar5] = P_FIXED;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
    goto LAB_001c0666;
  case D_ON_UPPER:
    pSVar10[iVar5] = P_ON_LOWER;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
    ::soplex::infinity::__tls_init();
    *leaveMax = -*(double *)(in_FS_OFFSET + -8);
    break;
  case D_ON_LOWER:
    pSVar10[iVar5] = P_ON_UPPER;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
    ::soplex::infinity::__tls_init();
    *leaveMax = *(double *)(in_FS_OFFSET + -8);
LAB_001c098c:
    lVar7 = (long)*leaveNum;
    dVar11 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    pdVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    goto LAB_001c09a2;
  case D_ON_BOTH:
    dVar11 = (this->theFvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[leaveIdx];
    pdVar1 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + leaveIdx;
    if (dVar11 < *pdVar1 || dVar11 == *pdVar1) {
      pSVar10[iVar5] = P_ON_UPPER;
      ::soplex::infinity::__tls_init();
      dVar11 = *(double *)(in_FS_OFFSET + -8);
      iVar5 = *leaveNum;
      (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar5] = dVar11;
      *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar5];
      ::soplex::infinity::__tls_init();
      *leaveMax = dVar11;
      goto LAB_001c098c;
    }
    pSVar10[iVar5] = P_ON_LOWER;
    ::soplex::infinity::__tls_init();
    dVar11 = *(double *)(in_FS_OFFSET + -8);
    iVar5 = *leaveNum;
    (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5] = -dVar11;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
    ::soplex::infinity::__tls_init();
    *leaveMax = -dVar11;
    break;
  case P_ON_LOWER:
    SVar6 = SPxBasisBase<double>::dualRowStatus(this_00,iVar5);
    iVar5 = *leaveNum;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    goto LAB_001c03a6;
  default:
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XLEAVE02 This should never happen.","");
    *puVar8 = &PTR__SPxException_006a9ee8;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar8 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar8 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    SVar6 = SPxBasisBase<double>::dualRowStatus(this_00,iVar5);
    iVar5 = *leaveNum;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    goto LAB_001c069c;
  case P_FREE:
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XLEAVE01 This should never happen.","");
    *puVar8 = &PTR__SPxException_006a9ee8;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar8 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar8 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  lVar7 = (long)*leaveNum;
  dVar11 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
  pdVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
LAB_001c09a2:
  dVar12 = objChange->sum;
  dVar2 = dVar12 + dVar11 * pdVar9[lVar7];
  objChange->c = (dVar11 * pdVar9[lVar7] - (dVar2 - dVar12)) + (dVar12 - (dVar2 - (dVar2 - dVar12)))
                 + objChange->c;
  objChange->sum = dVar2;
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals(
   int leaveIdx,
   typename SPxBasisBase<R>::Desc::Status& leaveStat,
   SPxId& leaveId,
   R& leaveMax,
   R& leavebound,
   int& leaveNum,
   StableSum<R>& objChange)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   leaveId = this->baseId(leaveIdx);

   if(leaveId.isSPxRowId())
   {
      leaveNum = this->number(SPxRowId(leaveId));
      leaveStat = ds.rowStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XLEAVE01 This should never happen.");

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         assert(this->lhs(leaveNum) == this->rhs(leaveNum));
         leavebound = -this->rhs(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = -this->rhs(leaveNum);                // slack !!
         leaveMax = R(infinity);
         objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = -this->lhs(leaveNum);                // slack !!
         leaveMax = R(-infinity);
         objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theLBbound[leaveIdx])
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            theLRbound[leaveNum] = R(-infinity);
            leavebound = -this->lhs(leaveNum);            // slack !!
            leaveMax = R(-infinity);
            objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         }
         else
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            theURbound[leaveNum] = R(infinity);
            leavebound = -this->rhs(leaveNum);            // slack !!
            leaveMax = R(infinity);
            objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE02 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE51 SPxSolverBase<R>::getLeaveVals() : row {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.rowStatus(leaveNum), objChange);
   }

   else
   {
      assert(leaveId.isSPxColId());
      leaveNum = this->number(SPxColId(leaveId));
      leaveStat = ds.colStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            leaveMax = R(-infinity);
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            leaveMax = R(infinity);
         }

         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         assert(SPxLPBase<R>::upper(leaveNum) == SPxLPBase<R>::lower(leaveNum));
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += this->maxObj(leaveNum) * leavebound;

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += theUCbound[leaveNum] * leavebound;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = SPxLPBase<R>::lower(leaveNum);
         objChange += theLCbound[leaveNum] * leavebound;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theUBbound[leaveIdx])
         {
            leaveMax = R(-infinity);
            leavebound = SPxLPBase<R>::upper(leaveNum);
            objChange += theUCbound[leaveNum] * leavebound;
            theLCbound[leaveNum] = R(-infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leaveMax = R(infinity);
            leavebound = SPxLPBase<R>::lower(leaveNum);
            objChange += theLCbound[leaveNum] * leavebound;
            theUCbound[leaveNum] = R(infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE03 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE52 SPxSolverBase<R>::getLeaveVals() : col {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.colStatus(leaveNum), objChange);
   }
}